

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O1

type __thiscall
dlib::
matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
::operator()(matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
             *this,long r,long c)

{
  matrix_op<dlib::op_pointer_to_mat<float>_> *pmVar1;
  matrix_op<dlib::op_pointer_to_mat<float>_> *pmVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = (this->lhs->op).stride * r;
  pmVar1 = (this->rhs->op).m1;
  pmVar2 = (this->rhs->op).m2;
  lVar3 = (pmVar1->op).stride * r;
  if ((pmVar2->op).cols == 1) {
    r = r * (pmVar2->op).stride;
  }
  return (this->lhs->op).ptr[lVar4 + c] - (pmVar1->op).ptr[lVar3 + c] * (pmVar2->op).ptr[r];
}

Assistant:

const type operator() (
            long r, 
            long c
        ) const { return lhs(r,c) - rhs(r,c); }